

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_4,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_4> *pVVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  float v;
  float fVar8;
  undefined4 uVar9;
  Vector<float,_2> res;
  float local_64 [3];
  Type in0;
  int local_40 [6];
  Type in1;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data[0] = (evalCtx->coords).m_data[0];
    in0.m_data[1] = (evalCtx->coords).m_data[1];
    in0.m_data[2] = (evalCtx->coords).m_data[2];
    in0.m_data[3] = (evalCtx->coords).m_data[3];
  }
  else {
    in0.m_data[0] = 1.4;
    in0.m_data[1] = 0.2;
    in0.m_data[2] = -0.5;
    in0.m_data[3] = 0.7;
  }
  pfVar1 = (float *)&in1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar9;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 == 0x10);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in1.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[2] = 0.0;
    in1.m_data.m_data[1].m_data[3] = 0.0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[2] = 0.0;
    in1.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &DAT_00b1d410;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar1[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 == 4);
      lVar3 = lVar3 + 1;
      pfVar1 = pfVar1 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar3 != 4);
  }
  pVVar2 = (Vector<float,_4> *)&in1;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar5 = 0;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_4>,_2> *)pVVar2->m_data)->m_data[0].m_data[lVar5]
                      * in0.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    res.m_data[lVar3] = fVar8;
    pVVar2 = pVVar2 + 1;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar3]] = res.m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}